

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O0

void __thiscall test_adjacency_graph_swap_Test::TestBody(test_adjacency_graph_swap_Test *this)

{
  element_type eVar1;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph_00;
  bool bVar2;
  char *pcVar3;
  reference peVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  AssertHelper local_518;
  Message local_510;
  size_t local_508;
  span<unsigned_long,_18446744073709551615UL> local_500;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar_17;
  Message local_4d8;
  size_t local_4d0;
  span<unsigned_long,_18446744073709551615UL> local_4c8;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_16;
  Message local_4a0;
  size_t local_498;
  span<unsigned_long,_18446744073709551615UL> local_490;
  undefined1 local_480 [8];
  AssertionResult gtest_ar_15;
  Message local_468;
  size_t local_460;
  span<unsigned_long,_18446744073709551615UL> local_458;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_14;
  Message local_430;
  size_t local_428;
  span<unsigned_long,_18446744073709551615UL> local_420;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_13;
  Message local_3f8;
  size_t local_3f0;
  span<unsigned_long,_18446744073709551615UL> local_3e8;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_12;
  Message local_3c0;
  size_t local_3b8;
  span<unsigned_long,_18446744073709551615UL> local_3b0;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_11;
  Message local_388;
  size_t local_380;
  span<unsigned_long,_18446744073709551615UL> local_378;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_10;
  Message local_350;
  size_t local_348;
  span<unsigned_long,_18446744073709551615UL> local_340;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_9;
  Message local_318;
  size_t local_310;
  span<unsigned_long,_18446744073709551615UL> local_308;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_8;
  Message local_2e0;
  size_t local_2d8;
  span<unsigned_long,_18446744073709551615UL> local_2d0;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_7;
  Message local_2a8;
  size_t local_2a0;
  span<unsigned_long,_18446744073709551615UL> local_298;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_6;
  Message local_270;
  size_t local_268;
  span<unsigned_long,_18446744073709551615UL> local_260;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_5;
  Message local_238;
  size_t local_230;
  span<unsigned_long,_18446744073709551615UL> local_228;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_4;
  Message local_200;
  int local_1f4;
  size_t local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_3;
  Message local_1d0;
  int local_1c4;
  size_t local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_2;
  Message local_1a0;
  int local_194;
  size_t local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_1;
  Message local_170;
  int local_164;
  size_t local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar;
  int local_140;
  int local_13c;
  int local_138;
  int local_128 [2];
  pair<unsigned_long,_unsigned_long> local_120;
  pair<unsigned_long,_unsigned_long> local_110;
  pair<unsigned_long,_unsigned_long> local_100;
  iterator local_f0;
  undefined8 local_e8;
  undefined1 local_e0 [8];
  Adjacency_Graph<true> graph_1;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  pair<unsigned_long,_unsigned_long> local_90;
  pair<unsigned_long,_unsigned_long> local_80;
  pair<unsigned_long,_unsigned_long> local_70;
  pair<unsigned_long,_unsigned_long> local_60;
  pair<unsigned_long,_unsigned_long> *local_50;
  undefined8 local_48;
  Adjacency_Graph<false> local_40 [8];
  Adjacency_Graph<true> graph_0;
  test_adjacency_graph_swap_Test *this_local;
  
  local_94 = 0;
  local_98 = 1;
  graph_0.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_90,&stack0xffffffffffffff6c,&stack0xffffffffffffff68);
  local_9c = 1;
  local_a0 = 2;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_80,&stack0xffffffffffffff64,&stack0xffffffffffffff60);
  local_a4 = 2;
  local_a8 = 3;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_70,&stack0xffffffffffffff5c,&stack0xffffffffffffff58);
  graph_1.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  graph_1.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 3;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_60,
             (int *)((long)&graph_1.offset.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
             (int *)&graph_1.offset.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  local_48 = 4;
  edge_graph_00._M_len = 4;
  edge_graph_00._M_array = &local_90;
  local_50 = &local_90;
  Disa::Adjacency_Graph<false>::Adjacency_Graph(local_40,edge_graph_00);
  local_128[1] = 0;
  local_128[0] = 1;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_120,local_128 + 1,local_128);
  local_138 = 1;
  local_13c = 2;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_110,&stack0xfffffffffffffec8,&stack0xfffffffffffffec4);
  local_140 = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 2;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_100,&stack0xfffffffffffffec0,
             (int *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  local_f0 = &local_120;
  local_e8 = 3;
  edge_graph._M_len = 3;
  edge_graph._M_array = local_f0;
  Disa::Adjacency_Graph<false>::Adjacency_Graph((Adjacency_Graph<false> *)local_e0,edge_graph);
  Disa::Adjacency_Graph<false>::swap(local_40,(Adjacency_Graph<true> *)local_e0);
  local_160 = Disa::Adjacency_Graph<false>::size_vertex(local_40);
  local_164 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_158,"graph_0.size_vertex()","3",&local_160,&local_164);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar2) {
    testing::Message::Message(&local_170);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1e8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  local_190 = Disa::Adjacency_Graph<false>::size_edge(local_40);
  local_194 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_188,"graph_0.size_edge()","3",&local_190,&local_194);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar2) {
    testing::Message::Message(&local_1a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1e9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  local_1c0 = Disa::Adjacency_Graph<false>::size_vertex((Adjacency_Graph<false> *)local_e0);
  local_1c4 = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1b8,"graph_1.size_vertex()","4",&local_1c0,&local_1c4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar2) {
    testing::Message::Message(&local_1d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1ea,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  local_1f0 = Disa::Adjacency_Graph<false>::size_edge((Adjacency_Graph<false> *)local_e0);
  local_1f4 = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1e8,"graph_1.size_edge()","4",&local_1f0,&local_1f4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar2) {
    testing::Message::Message(&local_200);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1eb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  local_230 = 0;
  local_228 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_230);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_228,0);
  eVar1 = *peVar4;
  auVar5._8_4_ = (int)(eVar1 >> 0x20);
  auVar5._0_8_ = eVar1;
  auVar5._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_218,"graph_0[0][0]","1",
             (auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)eVar1) - 4503599627370496.0),1.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar2) {
    testing::Message::Message(&local_238);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1ed,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  local_268 = 0;
  local_260 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_268);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_260,1);
  eVar1 = *peVar4;
  auVar6._8_4_ = (int)(eVar1 >> 0x20);
  auVar6._0_8_ = eVar1;
  auVar6._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_250,"graph_0[0][1]","2",
             (auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)eVar1) - 4503599627370496.0),2.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar2) {
    testing::Message::Message(&local_270);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1ee,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  local_2a0 = 1;
  local_298 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_2a0);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_298,0);
  eVar1 = *peVar4;
  auVar7._8_4_ = (int)(eVar1 >> 0x20);
  auVar7._0_8_ = eVar1;
  auVar7._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_288,"graph_0[1][0]","0",
             (auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)eVar1) - 4503599627370496.0),0.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar2) {
    testing::Message::Message(&local_2a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1ef,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  local_2d8 = 1;
  local_2d0 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_2d8);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_2d0,1);
  eVar1 = *peVar4;
  auVar8._8_4_ = (int)(eVar1 >> 0x20);
  auVar8._0_8_ = eVar1;
  auVar8._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2c0,"graph_0[1][1]","2",
             (auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)eVar1) - 4503599627370496.0),2.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar2) {
    testing::Message::Message(&local_2e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1f0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  local_310 = 2;
  local_308 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_310);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_308,0);
  eVar1 = *peVar4;
  auVar9._8_4_ = (int)(eVar1 >> 0x20);
  auVar9._0_8_ = eVar1;
  auVar9._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2f8,"graph_0[2][0]","0",
             (auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)eVar1) - 4503599627370496.0),0.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar2) {
    testing::Message::Message(&local_318);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1f1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  local_348 = 2;
  local_340 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_348);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_340,1);
  eVar1 = *peVar4;
  auVar10._8_4_ = (int)(eVar1 >> 0x20);
  auVar10._0_8_ = eVar1;
  auVar10._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_330,"graph_0[2][1]","1",
             (auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)eVar1) - 4503599627370496.0),1.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar2) {
    testing::Message::Message(&local_350);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1f2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  local_380 = 0;
  local_378 = Disa::Adjacency_Graph<false>::operator[]
                        ((Adjacency_Graph<false> *)local_e0,&local_380);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_378,0);
  eVar1 = *peVar4;
  auVar11._8_4_ = (int)(eVar1 >> 0x20);
  auVar11._0_8_ = eVar1;
  auVar11._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_368,"graph_1[0][0]","1",
             (auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)eVar1) - 4503599627370496.0),1.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar2) {
    testing::Message::Message(&local_388);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,499,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  local_3b8 = 0;
  local_3b0 = Disa::Adjacency_Graph<false>::operator[]
                        ((Adjacency_Graph<false> *)local_e0,&local_3b8);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_3b0,1);
  eVar1 = *peVar4;
  auVar12._8_4_ = (int)(eVar1 >> 0x20);
  auVar12._0_8_ = eVar1;
  auVar12._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_3a0,"graph_1[0][1]","3",
             (auVar12._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)eVar1) - 4503599627370496.0),3.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar2) {
    testing::Message::Message(&local_3c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,500,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  local_3f0 = 1;
  local_3e8 = Disa::Adjacency_Graph<false>::operator[]
                        ((Adjacency_Graph<false> *)local_e0,&local_3f0);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_3e8,0);
  eVar1 = *peVar4;
  auVar13._8_4_ = (int)(eVar1 >> 0x20);
  auVar13._0_8_ = eVar1;
  auVar13._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_3d8,"graph_1[1][0]","0",
             (auVar13._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)eVar1) - 4503599627370496.0),0.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar2) {
    testing::Message::Message(&local_3f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1f5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  local_428 = 1;
  local_420 = Disa::Adjacency_Graph<false>::operator[]
                        ((Adjacency_Graph<false> *)local_e0,&local_428);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_420,1);
  eVar1 = *peVar4;
  auVar14._8_4_ = (int)(eVar1 >> 0x20);
  auVar14._0_8_ = eVar1;
  auVar14._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_410,"graph_1[1][1]","2",
             (auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)eVar1) - 4503599627370496.0),2.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar2) {
    testing::Message::Message(&local_430);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1f6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  local_460 = 2;
  local_458 = Disa::Adjacency_Graph<false>::operator[]
                        ((Adjacency_Graph<false> *)local_e0,&local_460);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_458,0);
  eVar1 = *peVar4;
  auVar15._8_4_ = (int)(eVar1 >> 0x20);
  auVar15._0_8_ = eVar1;
  auVar15._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_448,"graph_1[2][0]","1",
             (auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)eVar1) - 4503599627370496.0),1.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar2) {
    testing::Message::Message(&local_468);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1f7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  local_498 = 2;
  local_490 = Disa::Adjacency_Graph<false>::operator[]
                        ((Adjacency_Graph<false> *)local_e0,&local_498);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_490,1);
  eVar1 = *peVar4;
  auVar16._8_4_ = (int)(eVar1 >> 0x20);
  auVar16._0_8_ = eVar1;
  auVar16._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_480,"graph_1[2][1]","3",
             (auVar16._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)eVar1) - 4503599627370496.0),3.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
  if (!bVar2) {
    testing::Message::Message(&local_4a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_480);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1f8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  local_4d0 = 3;
  local_4c8 = Disa::Adjacency_Graph<false>::operator[]
                        ((Adjacency_Graph<false> *)local_e0,&local_4d0);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_4c8,0);
  eVar1 = *peVar4;
  auVar17._8_4_ = (int)(eVar1 >> 0x20);
  auVar17._0_8_ = eVar1;
  auVar17._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_4b8,"graph_1[3][0]","0",
             (auVar17._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)eVar1) - 4503599627370496.0),0.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar2) {
    testing::Message::Message(&local_4d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1f9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  local_508 = 3;
  local_500 = Disa::Adjacency_Graph<false>::operator[]
                        ((Adjacency_Graph<false> *)local_e0,&local_508);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_500,1);
  eVar1 = *peVar4;
  auVar18._8_4_ = (int)(eVar1 >> 0x20);
  auVar18._0_8_ = eVar1;
  auVar18._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_4f0,"graph_1[3][1]","2",
             (auVar18._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)eVar1) - 4503599627370496.0),2.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
  if (!bVar2) {
    testing::Message::Message(&local_510);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1fa,pcVar3);
    testing::internal::AssertHelper::operator=(&local_518,&local_510);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)local_e0);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(local_40);
  return;
}

Assistant:

TEST(test_adjacency_graph, swap) {
  Adjacency_Graph<false> graph_0({{0, 1}, {1, 2}, {2, 3}, {0, 3}});  // quadrilateral graph
  Adjacency_Graph<false> graph_1({{0, 1}, {1, 2}, {0, 2}});          // 2-simplex graph

  graph_0.swap(graph_1);
  EXPECT_EQ(graph_0.size_vertex(), 3);
  EXPECT_EQ(graph_0.size_edge(), 3);
  EXPECT_EQ(graph_1.size_vertex(), 4);
  EXPECT_EQ(graph_1.size_edge(), 4);

  EXPECT_DOUBLE_EQ(graph_0[0][0], 1);
  EXPECT_DOUBLE_EQ(graph_0[0][1], 2);
  EXPECT_DOUBLE_EQ(graph_0[1][0], 0);
  EXPECT_DOUBLE_EQ(graph_0[1][1], 2);
  EXPECT_DOUBLE_EQ(graph_0[2][0], 0);
  EXPECT_DOUBLE_EQ(graph_0[2][1], 1);
  EXPECT_DOUBLE_EQ(graph_1[0][0], 1);
  EXPECT_DOUBLE_EQ(graph_1[0][1], 3);
  EXPECT_DOUBLE_EQ(graph_1[1][0], 0);
  EXPECT_DOUBLE_EQ(graph_1[1][1], 2);
  EXPECT_DOUBLE_EQ(graph_1[2][0], 1);
  EXPECT_DOUBLE_EQ(graph_1[2][1], 3);
  EXPECT_DOUBLE_EQ(graph_1[3][0], 0);
  EXPECT_DOUBLE_EQ(graph_1[3][1], 2);
}